

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::uhugeint_t,duckdb::uhugeint_t,bool,duckdb::BinarySingleArgumentOperatorWrapper,duckdb::GreaterThanEquals,bool,false,true>
               (uhugeint_t *ldata,uhugeint_t *rdata,bool *result_data,idx_t count,ValidityMask *mask
               ,bool fun)

{
  unsigned_long *puVar1;
  ulong uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  ulong uVar5;
  bool bVar6;
  ulong uVar7;
  idx_t iVar8;
  ulong uVar9;
  uhugeint_t *puVar10;
  ulong uVar11;
  ulong uVar12;
  uhugeint_t *local_88;
  uhugeint_t local_68;
  uhugeint_t local_58;
  ValidityMask *local_48;
  idx_t local_40;
  ulong local_38;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      uVar3 = rdata->lower;
      uVar4 = rdata->upper;
      iVar8 = 0;
      local_88 = ldata;
      do {
        local_58.lower = local_88->lower;
        local_58.upper = local_88->upper;
        local_68.lower = uVar3;
        local_68.upper = uVar4;
        bVar6 = uhugeint_t::operator>(&local_68,&local_58);
        result_data[iVar8] = !bVar6;
        iVar8 = iVar8 + 1;
        local_88 = local_88 + 1;
      } while (count != iVar8);
    }
  }
  else if (0x3f < count + 0x3f) {
    local_38 = count + 0x3f >> 6;
    uVar9 = 0;
    uVar7 = 0;
    local_48 = mask;
    local_40 = count;
    do {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar12 = uVar9 + 0x40;
        if (count <= uVar9 + 0x40) {
          uVar12 = count;
        }
LAB_0035310f:
        uVar5 = uVar9;
        if (uVar9 < uVar12) {
          uVar3 = rdata->lower;
          uVar4 = rdata->upper;
          puVar10 = ldata + uVar9;
          do {
            local_58.lower = puVar10->lower;
            local_58.upper = puVar10->upper;
            local_68.lower = uVar3;
            local_68.upper = uVar4;
            bVar6 = uhugeint_t::operator>(&local_68,&local_58);
            result_data[uVar9] = !bVar6;
            uVar9 = uVar9 + 1;
            puVar10 = puVar10 + 1;
            count = local_40;
            uVar5 = uVar12;
          } while (uVar12 != uVar9);
        }
      }
      else {
        uVar2 = puVar1[uVar7];
        uVar12 = uVar9 + 0x40;
        if (count <= uVar9 + 0x40) {
          uVar12 = count;
        }
        uVar5 = uVar12;
        if (uVar2 != 0) {
          if (uVar2 == 0xffffffffffffffff) goto LAB_0035310f;
          mask = local_48;
          uVar5 = uVar9;
          if (uVar9 < uVar12) {
            puVar10 = ldata + uVar9;
            uVar11 = 0;
            do {
              if ((uVar2 >> (uVar11 & 0x3f) & 1) != 0) {
                local_58.lower = puVar10->lower;
                local_58.upper = puVar10->upper;
                local_68.lower = rdata->lower;
                local_68.upper = rdata->upper;
                bVar6 = uhugeint_t::operator>(&local_68,&local_58);
                result_data[uVar11 + uVar9] = !bVar6;
              }
              uVar11 = uVar11 + 1;
              puVar10 = puVar10 + 1;
              mask = local_48;
              count = local_40;
              uVar5 = uVar12;
            } while (uVar12 - uVar9 != uVar11);
          }
        }
      }
      uVar9 = uVar5;
      uVar7 = uVar7 + 1;
    } while (uVar7 != local_38);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}